

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

Span<char> __thiscall
absl::lts_20240722::log_internal::EncodeMessageStart
          (log_internal *this,uint64_t tag,uint64_t max_size,Span<char> *buf)

{
  anon_unknown_1 *this_00;
  size_t sVar1;
  size_t value;
  pointer pcVar2;
  Span<char> SVar3;
  
  this_00 = (anon_unknown_1 *)((long)this * 8 + 2);
  sVar1 = VarintSize((uint64_t)this_00);
  if (*(ulong *)(max_size + 8) < tag) {
    tag = *(ulong *)(max_size + 8);
  }
  value = VarintSize(tag);
  if (*(ulong *)(max_size + 8) < value + sVar1) {
    *(undefined8 *)(max_size + 8) = 0;
    sVar1 = 0;
    pcVar2 = (pointer)0x0;
  }
  else {
    anon_unknown_1::EncodeRawVarint(this_00,sVar1,max_size,buf);
    pcVar2 = *(pointer *)max_size;
    sVar1 = value;
    if (*(ulong *)(max_size + 8) < value) {
      sVar1 = *(ulong *)(max_size + 8);
    }
    anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)0x0,value,max_size,buf);
  }
  SVar3.len_ = sVar1;
  SVar3.ptr_ = pcVar2;
  return SVar3;
}

Assistant:

ABSL_MUST_USE_RESULT absl::Span<char> EncodeMessageStart(
    uint64_t tag, uint64_t max_size, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  max_size = std::min<uint64_t>(max_size, buf->size());
  const size_t length_size = VarintSize(max_size);
  if (tag_type_size + length_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return absl::Span<char>();
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  const absl::Span<char> ret = buf->subspan(0, length_size);
  EncodeRawVarint(0, length_size, buf);
  return ret;
}